

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal_simd.c
# Opt level: O3

void FAudio_INTERNAL_ResampleGeneric
               (float *dCache,float *resampleCache,uint64_t *resampleOffset,uint64_t resampleStep,
               uint64_t toResample,uint8_t channels)

{
  uint64_t uVar1;
  ulong uVar2;
  uint64_t uVar3;
  long lVar4;
  
  if (toResample != 0) {
    uVar1 = *resampleOffset;
    uVar2 = 0;
    uVar3 = uVar1;
    do {
      if (channels != '\0') {
        lVar4 = 0;
        do {
          *(float *)((long)resampleCache + lVar4) =
               (float)((double)(*(float *)((long)dCache + lVar4 + (ulong)channels * 4) -
                               *(float *)((long)dCache + lVar4)) *
                       ((double)(uVar3 & 0xffffffff) * 2.3283064365386963e-10 + 0.0) +
                      (double)*(float *)((long)dCache + lVar4));
          lVar4 = lVar4 + 4;
        } while ((ulong)channels * 4 != lVar4);
        resampleCache = (float *)((long)resampleCache + lVar4);
      }
      uVar1 = uVar1 + resampleStep;
      uVar3 = (uVar3 & 0xffffffff) + resampleStep;
      dCache = dCache + (uVar3 >> 0x20) * (ulong)channels;
      uVar2 = (ulong)((int)uVar2 + 1);
    } while (uVar2 < toResample);
    *resampleOffset = uVar1;
  }
  return;
}

Assistant:

void FAudio_INTERNAL_ResampleGeneric(
	float *restrict dCache,
	float *restrict resampleCache,
	uint64_t *resampleOffset,
	uint64_t resampleStep,
	uint64_t toResample,
	uint8_t channels
) {
	uint32_t i, j;
	uint64_t cur = *resampleOffset & FIXED_FRACTION_MASK;
	for (i = 0; i < toResample; i += 1)
	{
		for (j = 0; j < channels; j += 1)
		{
			/* lerp, then convert to float value */
			*resampleCache++ = (float) (
				dCache[j] +
				(dCache[j + channels] - dCache[j]) *
				FIXED_TO_DOUBLE(cur)
			);
		}

		/* Increment fraction offset by the stepping value */
		*resampleOffset += resampleStep;
		cur += resampleStep;

		/* Only increment the sample offset by integer values.
		 * Sometimes this will be 0 until cur accumulates
		 * enough steps, especially for "slow" rates.
		 */
		dCache += (cur >> FIXED_PRECISION) * channels;

		/* Now that any integer has been added, drop it.
		 * The offset pointer will preserve the total.
		 */
		cur &= FIXED_FRACTION_MASK;
	}
}